

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projections.c
# Opt level: O0

void icetGetViewportProject
               (IceTInt x,IceTInt y,IceTSizeType width,IceTSizeType height,IceTDouble *mat_out)

{
  int local_38;
  int local_34;
  IceTInt global_viewport [4];
  IceTDouble *mat_out_local;
  IceTSizeType height_local;
  IceTSizeType width_local;
  IceTInt y_local;
  IceTInt x_local;
  
  icetGetIntegerv(0x12,&local_38);
  *mat_out = (IceTDouble)((double)global_viewport[0] / (double)width);
  mat_out[1] = 0.0;
  mat_out[2] = 0.0;
  mat_out[3] = 0.0;
  mat_out[4] = 0.0;
  mat_out[5] = (IceTDouble)((double)global_viewport[1] / (double)height);
  mat_out[6] = 0.0;
  mat_out[7] = 0.0;
  mat_out[8] = 0.0;
  mat_out[9] = 0.0;
  mat_out[10] = 1.0;
  mat_out[0xb] = 0.0;
  mat_out[0xc] = (IceTDouble)
                 ((double)((global_viewport[0] + local_38 * 2 + x * -2) - width) / (double)width);
  mat_out[0xd] = (IceTDouble)
                 ((double)((global_viewport[1] + local_34 * 2 + y * -2) - height) / (double)height);
  mat_out[0xe] = 0.0;
  mat_out[0xf] = 1.0;
  return;
}

Assistant:

void icetGetViewportProject(IceTInt x, IceTInt y, IceTSizeType width,
                            IceTSizeType height, IceTDouble *mat_out)
{
    IceTInt global_viewport[4];
/*     IceTDouble viewport_transform[16]; */
/*     IceTDouble tile_transform[16]; */

    icetGetIntegerv(ICET_GLOBAL_VIEWPORT, global_viewport);

/*     viewport_transform[ 0] = 0.5*global_viewport[2]; */
/*     viewport_transform[ 1] = 0.0; */
/*     viewport_transform[ 2] = 0.0; */
/*     viewport_transform[ 3] = 0.0; */

/*     viewport_transform[ 4] = 0.0; */
/*     viewport_transform[ 5] = 0.5*global_viewport[3]; */
/*     viewport_transform[ 6] = 0.0; */
/*     viewport_transform[ 7] = 0.0; */

/*     viewport_transform[ 8] = 0.0; */
/*     viewport_transform[ 9] = 0.0; */
/*     viewport_transform[10] = 1.0; */
/*     viewport_transform[11] = 0.0; */

/*     viewport_transform[12] = 0.5*global_viewport[2] + global_viewport[0]*; */
/*     viewport_transform[13] = 0.5*global_viewport[3] + global_viewport[1]*; */
/*     viewport_transform[14] = 0.0; */
/*     viewport_transform[15] = 1.0; */

/*     tile_transform[ 0] = 2.0/width; */
/*     tile_transform[ 1] = 0.0; */
/*     tile_transform[ 2] = 0.0; */
/*     tile_transform[ 3] = 0.0; */

/*     tile_transform[ 4] = 0.0; */
/*     tile_transform[ 5] = 2.0/height; */
/*     tile_transform[ 6] = 0.0; */
/*     tile_transform[ 7] = 0.0; */

/*     tile_transform[ 8] = 0.0; */
/*     tile_transform[ 9] = 0.0; */
/*     tile_transform[10] = 1.0; */
/*     tile_transform[11] = 0.0; */

/*     tile_transform[12] = -(2.0*x)/width - 1.0; */
/*     tile_transform[13] = -(2.0*y)/height - 1.0; */
/*     tile_transform[14] = 0.0; */
/*     tile_transform[15] = 1.0; */

/*     multMatrix(mat_out, tile_transform, viewport_transform); */

    mat_out[ 0] = (IceTDouble)global_viewport[2]/width;
    mat_out[ 1] = 0.0;
    mat_out[ 2] = 0.0;
    mat_out[ 3] = 0.0;

    mat_out[ 4] = 0.0;
    mat_out[ 5] = (IceTDouble)global_viewport[3]/height;
    mat_out[ 6] = 0.0;
    mat_out[ 7] = 0.0;

    mat_out[ 8] = 0.0;
    mat_out[ 9] = 0.0;
    mat_out[10] = 1.0;
    mat_out[11] = 0.0;

    mat_out[12] = (IceTDouble)(  global_viewport[2] + 2*global_viewport[0]
                             - 2*x - width)/width;
    mat_out[13] = (IceTDouble)(  global_viewport[3] + 2*global_viewport[1]
                             - 2*y - height)/height;
    mat_out[14] = 0.0;
    mat_out[15] = 1.0;
}